

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

void __thiscall ParialSphere_Normal_Test::~ParialSphere_Normal_Test(ParialSphere_Normal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParialSphere, Normal) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = rng.Uniform<Float>() < 0.5
                         ? -radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float zMax = rng.Uniform<Float>() < 0.5
                         ? radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);

        // Ray origin
        Point3f o;
        for (int c = 0; c < 3; ++c)
            o[c] = pExp(rng);

        // Destination: a random point in the shape's bounding box.
        Bounds3f bbox = sphere.Bounds();
        Point3f t;
        for (int c = 0; c < 3; ++c)
            t[c] = rng.Uniform<Float>();
        Point3f p2 = bbox.Lerp(t);

        // Ray to intersect with the shape.
        Ray r(o, p2 - o);
        if (rng.Uniform<Float>() < .5)
            r.d = Normalize(r.d);

        // We should usually (but not always) find an intersection.
        auto si = sphere.Intersect(r, Infinity);
        if (!si)
            continue;

        Float dot = Dot(Normalize(si->intr.n), Normalize(Vector3f(si->intr.p())));
        EXPECT_FLOAT_EQ(1., dot);
    }
}